

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::InfoWriter::Write(InfoWriter *this,char *key,string *value)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)this,"set(");
  poVar1 = std::operator<<(poVar1,key);
  poVar1 = std::operator<<(poVar1," ");
  cmOutputConverter::EscapeForCMake(&sStack_38,value);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::Write(const char* key,
                                               std::string const& value)
{
  Ofs_ << "set(" << key << " " << cmOutputConverter::EscapeForCMake(value)
       << ")\n";
}